

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile_test.cc
# Opt level: O1

int main(void)

{
  ExpandEmitter *pEVar1;
  TemplateString *pTVar2;
  PerExpandData data;
  string nothing_will_come_of_nothing;
  TemplateDictionary dict;
  PerExpandData local_118;
  TemplateString local_f0;
  char *local_d0;
  undefined8 local_c8;
  undefined1 local_c0;
  undefined8 local_b8;
  undefined1 local_b0 [24];
  DataMap *local_98;
  undefined **local_40;
  TemplateString *local_38;
  
  local_b0._0_8_ = "key";
  local_b0._8_8_ = (TemplateAnnotator *)0x3;
  local_b0[0x10] = true;
  local_98 = (DataMap *)0x0;
  local_f0.ptr_ = "example";
  local_f0.length_ = 7;
  local_f0.is_immutable_ = true;
  local_f0.id_ = 0;
  ctemplate::Template::StringToTemplateCache((TemplateString *)local_b0,&local_f0);
  local_b0._0_8_ = "key";
  local_b0._8_8_ = (TemplateAnnotator *)0x3;
  local_b0[0x10] = true;
  local_98 = (DataMap *)0x0;
  pEVar1 = (ExpandEmitter *)
           ctemplate::Template::GetTemplate((TemplateString *)local_b0,DO_NOT_STRIP);
  local_f0.ptr_ = "my dict";
  local_f0.length_ = 7;
  local_f0.is_immutable_ = true;
  local_f0.id_ = 0;
  ctemplate::TemplateDictionary::TemplateDictionary
            ((TemplateDictionary *)local_b0,&local_f0,(UnsafeArena *)0x0);
  local_f0.length_ = 0;
  local_f0.is_immutable_ = false;
  local_118.annotate_path_ = (char *)&PTR__ExpandEmitter_00104d48;
  local_118.annotator_ = (TemplateAnnotator *)&local_f0;
  local_f0.ptr_ = &local_f0.is_immutable_;
  ctemplate::default_template_cache();
  ctemplate::Template::ExpandWithDataAndCache
            (pEVar1,(TemplateDictionaryInterface *)&local_118,(PerExpandData *)local_b0,
             (TemplateCache *)0x0);
  local_118.expand_modifier_ = (TemplateModifier *)0x0;
  local_118.map_ = (DataMap *)0x0;
  local_118.annotate_path_ = (char *)0x0;
  local_118.annotator_ = (TemplateAnnotator *)0x0;
  local_f0.length_ = 0;
  *local_f0.ptr_ = false;
  local_d0 = "key";
  local_c8 = 3;
  local_c0 = 1;
  local_b8 = 0;
  pTVar2 = (TemplateString *)ctemplate::mutable_default_template_cache();
  local_40 = &PTR__ExpandEmitter_00104d48;
  local_38 = &local_f0;
  ctemplate::TemplateCache::ExpandWithData
            (pTVar2,(Strip)&local_d0,(TemplateDictionaryInterface *)0x0,(PerExpandData *)local_b0,
             (ExpandEmitter *)&local_118);
  puts("PASS.");
  ctemplate::PerExpandData::~PerExpandData(&local_118);
  if ((bool *)local_f0.ptr_ != &local_f0.is_immutable_) {
    operator_delete(local_f0.ptr_);
  }
  ctemplate::TemplateDictionary::~TemplateDictionary((TemplateDictionary *)local_b0);
  return 0;
}

Assistant:

int main() {
  template_ns::Template::StringToTemplateCache("key", "example");
  template_ns::Template* tpl = template_ns::Template::GetTemplate(
      "key", template_ns::DO_NOT_STRIP);
  template_ns::TemplateDictionary dict("my dict");
  std::string nothing_will_come_of_nothing;
  tpl->Expand(&nothing_will_come_of_nothing, &dict);

  // Try using a bit more functionality.
  template_ns::PerExpandData data;
  nothing_will_come_of_nothing.clear();
  template_ns::ExpandWithData("key", template_ns::DO_NOT_STRIP, &dict, &data,
                              &nothing_will_come_of_nothing);

  printf("PASS.\n");
  return 0;
}